

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

int recv_with_timeout(amqp_connection_state_t state,uint64_t start,timeval *timeout)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  int *piVar4;
  ssize_t sVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  pollfd pfd;
  pollfd local_48;
  long local_40;
  uint64_t local_38;
  
  if (timeout == (timeval *)0x0) {
    sVar5 = (*state->socket->klass->recv)
                      (state->socket,(state->sock_inbound_buffer).bytes,
                       (state->sock_inbound_buffer).len,0);
    uVar3 = (uint)sVar5;
    if (-1 < (int)uVar3) {
      state->sock_inbound_limit = (ulong)(uVar3 & 0x7fffffff);
      state->sock_inbound_offset = 0;
      if (0 < state->heartbeat) {
        uVar6 = amqp_get_monotonic_timestamp();
        if (uVar6 == 0) {
          return -0xe;
        }
        state->next_recv_heartbeat = (long)state->heartbeat * 2000000000 + uVar6;
      }
      uVar3 = 0;
    }
  }
  else {
    local_48.fd = amqp_get_sockfd(state);
    if (local_48.fd == -1) {
      uVar3 = 0xfffffff9;
    }
    else {
      if ((ulong)timeout->tv_usec / 1000 + timeout->tv_sec * 1000 < 0x80000000) {
        local_40 = 2;
        local_48.events = 1;
        local_48.revents = 0;
        auVar1 = SEXT816(0x20c49ba5e353f7cf) * SEXT816(timeout->tv_usec);
        local_38 = start;
        iVar2 = poll(&local_48,1,
                     ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) +
                     (int)timeout->tv_sec * 1000);
        if (iVar2 < 1) {
          lVar9 = 1;
          if (iVar2 != 0) {
            if (iVar2 == -1) {
              piVar4 = __errno_location();
              if (((*piVar4 == 4) && (uVar6 = amqp_get_monotonic_timestamp(), uVar6 != 0)) &&
                 (uVar7 = timeout->tv_usec * 1000 + timeout->tv_sec * 1000000000 + local_38,
                 uVar8 = uVar7 - uVar6, uVar6 <= uVar7)) {
                timeout->tv_sec = uVar8 / 1000000000;
                timeout->tv_usec = (uVar8 % 1000000000) / 1000;
                iVar2 = (*(code *)((long)&DAT_0010ec94 + (long)(int)(&DAT_0010ec94)[local_40]))();
                return iVar2;
              }
            }
            else {
              lVar9 = 0;
            }
          }
        }
        else {
          lVar9 = 3;
        }
        iVar2 = (*(code *)((long)&DAT_0010ec94 + (long)(int)(&DAT_0010ec94)[lVar9]))();
        return iVar2;
      }
      uVar3 = 0xfffffff6;
    }
  }
  return uVar3;
}

Assistant:

static int recv_with_timeout(amqp_connection_state_t state, uint64_t start, struct timeval *timeout)
{
  int res;

  if (timeout) {
    int fd;

    fd = amqp_get_sockfd(state);
    if (-1 == fd) {
      return AMQP_STATUS_CONNECTION_CLOSED;
    }

    if (INT_MAX < (uint64_t)timeout->tv_sec * AMQP_MS_PER_S +
        (uint64_t)timeout->tv_usec / AMQP_US_PER_MS) {
      return AMQP_STATUS_INVALID_PARAMETER;
    }

    while (1) {
      struct pollfd pfd;
      int timeout_ms;

      pfd.fd = fd;
      pfd.events = POLLIN;
      pfd.revents = 0;

      timeout_ms = timeout->tv_sec * AMQP_MS_PER_S +
          timeout->tv_usec / AMQP_US_PER_MS;

      res = poll(&pfd, 1, timeout_ms);

      if (0 < res) {
        break;
      } else if (0 == res) {
        return AMQP_STATUS_TIMEOUT;
      } else if (-1 == res) {
        if (EINTR == errno) {
          if (timeout) {
            uint64_t end_timestamp;
            uint64_t time_left;
            uint64_t current_timestamp = amqp_get_monotonic_timestamp();
            if (0 == current_timestamp) {
              return AMQP_STATUS_TIMER_FAILURE;
            }
            end_timestamp = start +
              (uint64_t)timeout->tv_sec * AMQP_NS_PER_S +
              (uint64_t)timeout->tv_usec * AMQP_NS_PER_US;
            if (current_timestamp > end_timestamp) {
              return AMQP_STATUS_TIMEOUT;
            }

            time_left = end_timestamp - current_timestamp;

            timeout->tv_sec = time_left / AMQP_NS_PER_S;
            timeout->tv_usec = (time_left % AMQP_NS_PER_S) / AMQP_NS_PER_US;
          }
          continue;
        }
        return AMQP_STATUS_SOCKET_ERROR;
      }
    }
  }

  res = amqp_socket_recv(state->socket, state->sock_inbound_buffer.bytes,
                         state->sock_inbound_buffer.len, 0);

  if (res < 0) {
    return res;
  }

  state->sock_inbound_limit = res;
  state->sock_inbound_offset = 0;

  if (amqp_heartbeat_enabled(state)) {
    uint64_t current_time = amqp_get_monotonic_timestamp();
    if (0 == current_time) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
    state->next_recv_heartbeat = amqp_calc_next_recv_heartbeat(state, current_time);
  }

  return AMQP_STATUS_OK;
}